

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
__thiscall pstore::broker::parse(broker *this,message_type *msg,partial_cmds *cmds)

{
  bool bVar1;
  part_number_too_large *this_00;
  rep rVar2;
  pointer ppVar3;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_01;
  size_type sVar4;
  number_of_parts_mismatch *this_02;
  reference pvVar5;
  pointer pbVar6;
  iterator iVar7;
  iterator iVar8;
  reference this_03;
  type pbVar9;
  __enable_if_t<is_constructible<value_type,_pair<pair<unsigned_int,_unsigned_int>,_pieces>_&&>::value,_pair<iterator,_bool>_>
  _Var10;
  range rVar11;
  pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar12;
  pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  string local_1e0;
  string local_1c0;
  iterator local_1a0;
  iterator local_198;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  undefined1 local_188 [8];
  pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_parts;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  iterator local_168;
  undefined1 local_160 [8];
  range verb_parts;
  iterator end;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *c;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range4;
  string complete_command;
  anon_class_1_0_00000001 not_null;
  bool was_missing;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *value;
  pieces local_c0;
  pair<std::pair<unsigned_int,_unsigned_int>,_pstore::broker::pieces> local_a0;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  local_78;
  undefined1 local_70;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  local_68;
  pair<unsigned_long,_unsigned_long> local_60;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  local_50;
  iterator it;
  pair<unsigned_int,_unsigned_int> key;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  payload;
  time_point now;
  partial_cmds *cmds_local;
  message_type *msg_local;
  
  if (msg->num_parts <= msg->part_no) {
    this_00 = (part_number_too_large *)__cxa_allocate_exception(0x10);
    part_number_too_large::part_number_too_large(this_00);
    __cxa_throw(this_00,&part_number_too_large::typeinfo,
                part_number_too_large::~part_number_too_large);
  }
  rVar2 = std::chrono::_V2::system_clock::now();
  (anonymous_namespace)::extract_payload_abi_cxx11_((_anonymous_namespace_ *)&key,msg);
  it.
  super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
             )std::make_pair<unsigned_int_const&,unsigned_int_const&>
                        (&msg->sender_id,&msg->message_id);
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_int,_unsigned_int,_true>
            (&local_60,(pair<unsigned_int,_unsigned_int> *)&it);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>_>
       ::find(cmds,&local_60);
  local_68._M_cur =
       (__node_type *)
       std::
       end<std::unordered_map<std::pair<unsigned_long,unsigned_long>,pstore::broker::pieces,std::hash<std::pair<unsigned_long,unsigned_long>>,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>>>
                 (cmds);
  bVar1 = std::__detail::operator==(&local_50,&local_68);
  if (bVar1) {
    std::chrono::
    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(&local_c0.arrive_time_);
    local_c0.s_.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0.s_.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c0.s_.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::vector(&local_c0.s_);
    std::make_pair<std::pair<unsigned_int,unsigned_int>const&,pstore::broker::pieces>
              (&local_a0,(pair<unsigned_int,_unsigned_int> *)&it,&local_c0);
    _Var10 = std::
             unordered_map<std::pair<unsigned_long,unsigned_long>,pstore::broker::pieces,std::hash<std::pair<unsigned_long,unsigned_long>>,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>>
             ::insert<std::pair<std::pair<unsigned_int,unsigned_int>,pstore::broker::pieces>>
                       ((unordered_map<std::pair<unsigned_long,unsigned_long>,pstore::broker::pieces,std::hash<std::pair<unsigned_long,unsigned_long>>,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>>
                         *)cmds,&local_a0);
    local_78._M_cur =
         (__node_type *)
         _Var10.first.
         super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
         ._M_cur;
    local_70 = _Var10.second;
    local_50._M_cur = local_78._M_cur;
    std::pair<std::pair<unsigned_int,_unsigned_int>,_pstore::broker::pieces>::~pair(&local_a0);
    pieces::~pieces(&local_c0);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
                           *)&local_50);
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::resize(&(ppVar3->second).s_,(ulong)msg->num_parts);
  }
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
                         *)&local_50);
  (ppVar3->second).arrive_time_.__d.__r = rVar2;
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
                         *)&local_50);
  this_01 = &(ppVar3->second).s_;
  sVar4 = std::
          vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::size(this_01);
  if (sVar4 != msg->num_parts) {
    this_02 = (number_of_parts_mismatch *)__cxa_allocate_exception(0x10);
    number_of_parts_mismatch::number_of_parts_mismatch(this_02);
    __cxa_throw(this_02,&number_of_parts_mismatch::typeinfo,
                number_of_parts_mismatch::~number_of_parts_mismatch);
  }
  pvVar5 = std::
           vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](this_01,(ulong)msg->part_no);
  pbVar6 = std::
           unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get(pvVar5);
  pvVar5 = std::
           vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](this_01,(ulong)msg->part_no);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar5,(unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&key);
  if (pbVar6 == (pointer)0x0) {
    iVar7 = std::
            begin<std::vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
                      (this_01);
    iVar8 = std::
            end<std::vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
                      (this_01);
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>*,std::vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>,pstore::broker::parse(pstore::brokerface::message_type_const&,std::unordered_map<std::pair<unsigned_long,unsigned_long>,pstore::broker::pieces,std::hash<std::pair<unsigned_long,unsigned_long>>,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>>&)::__0>
                      (iVar7._M_current,iVar8._M_current);
    if (bVar1) {
      std::__cxx11::string::string((string *)&__range4);
      __end4 = std::
               vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::begin(this_01);
      c = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)std::
             vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                         *)&c), bVar1) {
        this_03 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator*(&__end4);
        pbVar6 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::get(this_03);
        if (pbVar6 == (pointer)0x0) {
          assert_failed("c.get () != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/parser.cpp"
                        ,0x67);
        }
        pbVar9 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(this_03);
        std::__cxx11::string::operator+=((string *)&__range4,(string *)pbVar9);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator++(&__end4);
      }
      std::
      unordered_map<std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>_>
      ::erase(cmds,(iterator)local_50._M_cur);
      verb_parts.second._M_current =
           (char *)std::end<std::__cxx11::string>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__range4);
      local_170._M_current =
           (char *)std::begin<std::__cxx11::string>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__range4);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_168,&local_170);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&path_parts.second,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&verb_parts.second);
      rVar11 = anon_unknown.dwarf_9c0aa::extract_word
                         (local_168,(iterator)path_parts.second._M_current);
      local_198._M_current = (char *)rVar11.second._M_current;
      local_160 = (undefined1  [8])rVar11.first._M_current;
      verb_parts.first._M_current = local_198._M_current;
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1a0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&verb_parts.second);
      local_190._M_current = (char *)anon_unknown.dwarf_9c0aa::skip_ws(local_198,local_1a0);
      pVar12 = std::
               make_pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&>
                         (&local_190,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&verb_parts.second);
      path_parts.first._M_current = (char *)pVar12.second._M_current;
      local_188 = (undefined1  [8])pVar12.first._M_current;
      anon_unknown.dwarf_9c0aa::substr(&local_1c0,(range *)local_160);
      std::
      pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::
      pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                (&local_1f0,
                 (pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_188);
      anon_unknown.dwarf_9c0aa::substr(&local_1e0,&local_1f0);
      std::make_unique<pstore::broker::broker_command,std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 &local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&__range4);
      goto LAB_00148afb;
    }
  }
  std::
  unique_ptr<pstore::broker::broker_command,std::default_delete<pstore::broker::broker_command>>::
  unique_ptr<std::default_delete<pstore::broker::broker_command>,void>
            ((unique_ptr<pstore::broker::broker_command,std::default_delete<pstore::broker::broker_command>>
              *)this,(nullptr_t)0x0);
LAB_00148afb:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&key);
  return (__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
          )(__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<broker_command> parse (brokerface::message_type const & msg,
                                               partial_cmds & cmds) {

            if (msg.part_no >= msg.num_parts) {
                throw part_number_too_large ();
            }

            auto const now = std::chrono::system_clock::now ();

            auto payload = extract_payload (msg);

            auto const key = std::make_pair (msg.sender_id, msg.message_id);
            auto it = cmds.find (key);
            if (it == std::end (cmds)) {
                it = cmds.insert (std::make_pair (key, pieces{})).first;
                it->second.s_.resize (msg.num_parts);
            }

            // Record the arrival time of this newest message of the set.
            it->second.arrive_time_ = now;
            auto & value = it->second.s_;
            if (value.size () != msg.num_parts) {
                throw number_of_parts_mismatch ();
            }

            bool const was_missing = value[msg.part_no].get () == nullptr;
            value[msg.part_no] = std::move (payload);

            if (was_missing) {
                auto not_null = [] (std::unique_ptr<std::string> const & str) {
                    return str != nullptr;
                };
                if (std::all_of (std::begin (value), std::end (value), not_null)) {
                    std::string complete_command;
                    for (auto const & c : value) {
                        PSTORE_ASSERT (c.get () != nullptr);
                        complete_command += *c;
                    }

                    cmds.erase (it);

                    auto end = std::end (complete_command);
                    auto const verb_parts = extract_word (std::begin (complete_command), end);
                    auto const path_parts = std::make_pair (skip_ws (verb_parts.second, end), end);
                    return std::make_unique<broker_command> (substr (verb_parts),
                                                             substr (path_parts));
                }
            }

            return nullptr;
        }